

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

CharacterNode * __thiscall
icu_63::TextTrieMap::getChildNode(TextTrieMap *this,CharacterNode *parent,UChar c)

{
  CharacterNode *pCVar1;
  UChar childCharacter;
  CharacterNode *current;
  uint16_t nodeIndex;
  UChar c_local;
  CharacterNode *parent_local;
  TextTrieMap *this_local;
  
  current._4_2_ = parent->fFirstChild;
  while( true ) {
    if (current._4_2_ == 0) {
      return (CharacterNode *)0x0;
    }
    pCVar1 = this->fNodes + (int)(uint)current._4_2_;
    if (pCVar1->fCharacter == c) break;
    if ((ushort)c < (ushort)pCVar1->fCharacter) {
      return (CharacterNode *)0x0;
    }
    current._4_2_ = pCVar1->fNextSibling;
  }
  return pCVar1;
}

Assistant:

CharacterNode*
TextTrieMap::getChildNode(CharacterNode *parent, UChar c) const {
    // Linear search of the sorted list of children.
    uint16_t nodeIndex = parent->fFirstChild;
    while (nodeIndex > 0) {
        CharacterNode *current = fNodes + nodeIndex;
        UChar childCharacter = current->fCharacter;
        if (childCharacter == c) {
            return current;
        } else if (childCharacter > c) {
            break;
        }
        nodeIndex = current->fNextSibling;
    }
    return NULL;
}